

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional.h
# Opt level: O2

bool __thiscall
pybind11::detail::type_caster<std::function<void_(kratos::Generator_*)>,_void>::load
          (type_caster<std::function<void_(kratos::Generator_*)>,_void> *this,handle src,
          bool convert)

{
  object oVar1;
  bool bVar2;
  handle hVar3;
  function_record *pfVar4;
  func_handle local_38;
  handle local_30;
  function func;
  capsule c;
  
  if (src.m_ptr != (PyObject *)&_Py_NoneStruct) {
    bVar2 = function::check_(src);
    if (bVar2) {
      if (src.m_ptr != (PyObject *)0x0) {
        (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
      }
      local_30.m_ptr = src.m_ptr;
      hVar3 = function::cpp_function((function *)&local_30);
      if ((((hVar3.m_ptr != (PyObject *)0x0) &&
           ((*(byte *)(hVar3.m_ptr[1].ob_refcnt + 0x10) & 0x20) == 0)) &&
          (oVar1.super_handle.m_ptr = (handle)hVar3.m_ptr[1].ob_type,
          oVar1.super_handle.m_ptr != (PyObject *)0x0)) &&
         (*(PyTypeObject **)((long)oVar1.super_handle.m_ptr + 8) == (PyTypeObject *)&PyCapsule_Type)
         ) {
        *(long *)oVar1.super_handle.m_ptr = *(long *)oVar1.super_handle.m_ptr + 1;
        func.super_object.super_handle.m_ptr = (object)(object)oVar1.super_handle.m_ptr;
        for (pfVar4 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)&func);
            pfVar4 != (function_record *)0x0; pfVar4 = pfVar4->next) {
          if ((pfVar4->field_0x59 & 4) != 0) {
            bVar2 = std::type_info::operator==
                              ((type_info *)&(*)(kratos::Generator*)::typeinfo,
                               (type_info *)pfVar4->data[1]);
            if (bVar2) {
              std::function<void(kratos::Generator*)>::operator=
                        ((function<void(kratos::Generator*)> *)this,
                         (_func_void_Generator_ptr **)pfVar4->data);
              object::~object(&func.super_object);
              goto LAB_00327ac4;
            }
          }
        }
        object::~object(&func.super_object);
      }
      local_38.f.super_object.super_handle.m_ptr = (function)(function)local_30.m_ptr;
      local_30.m_ptr = (PyObject *)0x0;
      type_caster<std::function<void(kratos::Generator*)>,void>::load(pybind11::handle,bool)::
      func_wrapper::func_wrapper(pybind11::detail::type_caster<std::function<void(kratos::
      Generator*)>,void>::load(pybind11::handle,bool)::func_handle___
                ((func_wrapper *)&func,&local_38);
      std::function<void(kratos::Generator*)>::operator=
                ((function<void(kratos::Generator*)> *)this,(func_wrapper *)&func);
      load::func_handle::~func_handle((func_handle *)&func);
      load::func_handle::~func_handle(&local_38);
LAB_00327ac4:
      object::~object((object *)&local_30);
      convert = true;
    }
    else {
      convert = false;
    }
  }
  return convert;
}

Assistant:

bool load(handle src, bool convert) {
        if (src.is_none()) {
            // Defer accepting None to other overloads (if we aren't in convert mode):
            if (!convert) return false;
            return true;
        }

        if (!isinstance<function>(src))
            return false;

        auto func = reinterpret_borrow<function>(src);

        /*
           When passing a C++ function as an argument to another C++
           function via Python, every function call would normally involve
           a full C++ -> Python -> C++ roundtrip, which can be prohibitive.
           Here, we try to at least detect the case where the function is
           stateless (i.e. function pointer or lambda function without
           captured variables), in which case the roundtrip can be avoided.
         */
        if (auto cfunc = func.cpp_function()) {
            auto cfunc_self = PyCFunction_GET_SELF(cfunc.ptr());
            if (isinstance<capsule>(cfunc_self)) {
                auto c = reinterpret_borrow<capsule>(cfunc_self);
                auto rec = (function_record *) c;

                while (rec != nullptr) {
                    if (rec->is_stateless
                        && same_type(typeid(function_type),
                                     *reinterpret_cast<const std::type_info *>(rec->data[1]))) {
                        struct capture {
                            function_type f;
                        };
                        value = ((capture *) &rec->data)->f;
                        return true;
                    }
                    rec = rec->next;
                }
            }
            // PYPY segfaults here when passing builtin function like sum.
            // Raising an fail exception here works to prevent the segfault, but only on gcc.
            // See PR #1413 for full details
        }

        // ensure GIL is held during functor destruction
        struct func_handle {
            function f;
#if !(defined(_MSC_VER) && _MSC_VER == 1916 && defined(PYBIND11_CPP17) && PY_MAJOR_VERSION < 3)
            // This triggers a syntax error under very special conditions (very weird indeed).
            explicit
#endif
            func_handle(function &&f_) noexcept : f(std::move(f_)) {}
            func_handle(const func_handle &f_) { operator=(f_); }
            func_handle &operator=(const func_handle &f_) {
                gil_scoped_acquire acq;
                f = f_.f;
                return *this;
            }
            ~func_handle() {
                gil_scoped_acquire acq;
                function kill_f(std::move(f));
            }
        };

        // to emulate 'move initialization capture' in C++11
        struct func_wrapper {
            func_handle hfunc;
            explicit func_wrapper(func_handle &&hf) noexcept : hfunc(std::move(hf)) {}
            Return operator()(Args... args) const {
                gil_scoped_acquire acq;
                object retval(hfunc.f(std::forward<Args>(args)...));
                /* Visual studio 2015 parser issue: need parentheses around this expression */
                return (retval.template cast<Return>());
            }
        };

        value = func_wrapper(func_handle(std::move(func)));
        return true;
    }